

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.c
# Opt level: O1

char ** adjustFlags(char **FLAG,int height,int width,int imax,int jmax)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char **ppcVar4;
  long lVar5;
  char cVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  short sVar12;
  
  if (FLAG == (char **)0x0) {
    FLAG = (char **)0x0;
  }
  else {
    ppcVar4 = create2DIntegerField(imax,jmax);
    if (ppcVar4 != (char **)0x0) {
      if (0 < imax) {
        uVar10 = 0;
        do {
          if (0 < jmax) {
            iVar11 = ((int)uVar10 * width) / imax;
            iVar1 = (((int)uVar10 + 1) * width) / imax;
            uVar8 = 0;
            do {
              iVar2 = 0;
              if (iVar11 <= iVar1) {
                iVar9 = ((int)uVar8 * height) / jmax;
                iVar2 = (((int)uVar8 + 1) * height) / jmax;
                sVar12 = 0;
                lVar5 = (long)iVar11;
                do {
                  lVar7 = (long)iVar9;
                  iVar3 = (iVar2 - iVar9) + 1;
                  if (iVar9 <= iVar2) {
                    do {
                      if ((lVar5 != width) && (height != lVar7)) {
                        sVar12 = sVar12 + FLAG[lVar5][lVar7];
                      }
                      lVar7 = lVar7 + 1;
                      iVar3 = iVar3 + -1;
                    } while (iVar3 != 0);
                  }
                  lVar5 = lVar5 + 1;
                } while (iVar1 + 1 != (int)lVar5);
                iVar2 = (int)sVar12;
              }
              cVar6 = '\x0f';
              if ((width * height) / (imax * jmax * 2) < iVar2) {
                cVar6 = '\0';
              }
              ppcVar4[uVar10][uVar8] = cVar6;
              uVar8 = uVar8 + 1;
            } while (uVar8 != (uint)jmax);
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 != (uint)imax);
      }
      destroy2Dfield(FLAG,width);
      FLAG = ppcVar4;
    }
  }
  return FLAG;
}

Assistant:

char** adjustFlags (char **FLAG, int height, int width, int imax, int jmax)
{
	/* Adjust the number of cells to a predefined number */
	if (FLAG == NULL)
		return FLAG;
	char **newFLAG = create2DIntegerField(imax,jmax);
	if (newFLAG == NULL)
		return FLAG;
	short average;
	for (int i = 0; i < imax; i++)
	{
		for (int j = 0; j < jmax; j++)
		{
			average = 0;
			for (int k = (i*width)/imax; k <= ((i+1)*width)/imax; k++)
				for (int l = (j*height)/jmax; l <= ((j+1)*height)/jmax; l++)
				{
					if (k == width || l == height)
						continue;
					average += FLAG[k][l];
				}
			if (average > (width*height)/(imax*jmax*2))
				newFLAG[i][j] = C_B;
			else
				newFLAG[i][j] = C_F;
		}
	}
	destroy2Dfield((void**)FLAG,width);
	return newFLAG;
}